

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

ArrayFeatureType_EnumeratedShapes * __thiscall
CoreML::Specification::ArrayFeatureType::mutable_enumeratedshapes(ArrayFeatureType *this)

{
  ArrayFeatureType_EnumeratedShapes *this_00;
  
  if (this->_oneof_case_[0] == 0x15) {
    this_00 = (this->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x15;
    this_00 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(this_00);
    (this->ShapeFlexibility_).enumeratedshapes_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_EnumeratedShapes* ArrayFeatureType::mutable_enumeratedshapes() {
  if (!has_enumeratedshapes()) {
    clear_ShapeFlexibility();
    set_has_enumeratedshapes();
    ShapeFlexibility_.enumeratedshapes_ = new ::CoreML::Specification::ArrayFeatureType_EnumeratedShapes;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ArrayFeatureType.enumeratedShapes)
  return ShapeFlexibility_.enumeratedshapes_;
}